

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

Vector3d * __thiscall OpenMD::Thermo::getCom(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  uint i_1;
  Molecule *this_01;
  long lVar1;
  MoleculeIterator i;
  double local_a0;
  Vector3d local_98;
  double local_78;
  MoleculeIterator local_70;
  double local_68 [4];
  Vector3d local_48;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasCOM == false) {
    local_70._M_node = (_Base_ptr)0x0;
    local_98.super_Vector<double,_3U>.data_[2] = 0.0;
    local_98.super_Vector<double,_3U>.data_[0] = 0.0;
    local_98.super_Vector<double,_3U>.data_[1] = 0.0;
    this_01 = SimInfo::beginMolecule(this->info_,&local_70);
    if (this_01 == (Molecule *)0x0) {
      local_a0 = 0.0;
    }
    else {
      local_a0 = 0.0;
      do {
        local_78 = Molecule::getMass(this_01);
        Molecule::getCom(&local_48,this_01);
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        lVar1 = 0;
        do {
          local_68[lVar1] = local_48.super_Vector<double,_3U>.data_[lVar1] * local_78;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        lVar1 = 0;
        do {
          local_98.super_Vector<double,_3U>.data_[lVar1] =
               local_68[lVar1] + local_98.super_Vector<double,_3U>.data_[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        local_a0 = local_a0 + local_78;
        this_01 = SimInfo::nextMolecule(this->info_,&local_70);
      } while (this_01 != (Molecule *)0x0);
    }
    lVar1 = 0;
    do {
      local_98.super_Vector<double,_3U>.data_[lVar1] =
           local_98.super_Vector<double,_3U>.data_[lVar1] / local_a0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    Snapshot::setCOM(this_00,&local_98);
  }
  Snapshot::getCOM(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getCom() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOM) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d com(0.0);
      RealType totalMass(0.0);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        com += mass * mol->getCom();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, com.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      com /= totalMass;
      snap->setCOM(com);
    }
    return snap->getCOM();
  }